

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O1

void __thiscall ccs::CcsDomain::logRuleDag(CcsDomain *this,ostream *os)

{
  _Head_base<0UL,_ccs::DagBuilder_*,_false> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  Dumper local_20;
  
  _Var1._M_head_impl =
       (this->dag)._M_t.
       super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>._M_t.
       super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
       super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl;
  local_20.node_ =
       ((_Var1._M_head_impl)->root_).super___shared_ptr<ccs::Node,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  this_00._M_pi =
       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var1._M_head_impl)->root_ + 8))->
       _M_pi;
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
    }
  }
  local_20._vptr_Dumper = (_func_int **)&PTR__Dumper_0015bf88;
  operator<<(os,&local_20);
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return;
}

Assistant:

void CcsDomain::logRuleDag(std::ostream &os) const {
  os << Dumper(*dag->root());
}